

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_d3d56.cc
# Opt level: O1

void __thiscall hwtest::pgraph::MthdD3D56TexFilter::emulate_mthd(MthdD3D56TexFilter *this)

{
  byte *pbVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  uVar2 = (this->super_SingleMthdTest).super_MthdTest.val;
  uVar3 = this->which;
  uVar4 = uVar2 & 0xffff9e1e;
  if ((uVar3 & 1) != 0) {
    pbVar1 = (byte *)((long)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid +
                     6);
    *pbVar1 = *pbVar1 | 1;
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.d3d56_tex_filter[0] = uVar4;
  }
  if ((-1 < (short)uVar2 && (this->super_SingleMthdTest).super_MthdTest.cls == 0x54) &&
      (uVar2 >> 0x18 & 7) - 5 < 2) {
    uVar5 = uVar2 >> 0x10 & 0xff;
    uVar4 = (uVar2 >> 0x10) + 8 & 0xff;
    if (0xfffffff7 < uVar5 - 0x80) {
      uVar4 = uVar5;
    }
    uVar4 = uVar4 << 0x10 | uVar2 & 0xff001e1e;
  }
  if ((uVar3 & 2) != 0) {
    pbVar1 = (byte *)((long)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid +
                     6);
    *pbVar1 = *pbVar1 | 0x80;
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.d3d56_tex_filter[1] = uVar4;
  }
  return;
}

Assistant:

void emulate_mthd() override {
		bool is_mip = extr(val, 24, 3) == 5 || extr(val, 24, 3) == 6;
		uint32_t rval = val & 0xffff9e1e;
		if (which & 1) {
			insrt(exp.valid[1], 16, 1, 1);
			exp.d3d56_tex_filter[0] = rval;
		}
		if (cls == 0x54 && is_mip && !extr(val, 15, 1)) {
			int bias = extr(val, 16, 8);
			if (bias < 0x78 || bias >= 0x80)
				bias += 8;
			insrt(rval, 16, 8, bias);
		}
		if (which & 2) {
			insrt(exp.valid[1], 23, 1, 1);
			exp.d3d56_tex_filter[1] = rval;
		}
	}